

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zuncompress.c
# Opt level: O0

int zuncompress2mem(char *filename,FILE *indiskfile,char **buffptr,size_t *buffsize,
                   _func_void_ptr_void_ptr_size_t *mem_realloc,size_t *filesize,int *status)

{
  int iVar1;
  int iVar2;
  size_t *in_RCX;
  void **in_RDX;
  FILE *in_RSI;
  char *in_RDI;
  _func_void_ptr_void_ptr_size_t *in_R8;
  long *in_R9;
  int *in_stack_00000008;
  char magic [2];
  FILE *in_stack_00000058;
  uch local_44;
  int in_stack_ffffffffffffffc0;
  undefined2 local_3a;
  int local_4;
  
  if (*in_stack_00000008 < 1) {
    ifname[0] = '\0';
    strncat(ifname,in_RDI,0x7f);
    inptr = 0;
    insize = 0;
    bytes_out = 0;
    bytes_in = 0;
    ifd = in_RSI;
    memptr = in_RDX;
    memsize = in_RCX;
    realloc_fn = in_R8;
    iVar2 = fill_inbuf(in_stack_ffffffffffffffc0);
    if (inptr < insize) {
      local_44 = inbuf[inptr];
      inptr = inptr + 1;
    }
    else {
      iVar1 = fill_inbuf(iVar2);
      local_44 = (uch)iVar1;
    }
    local_3a = CONCAT11(local_44,(char)iVar2);
    if (local_3a == -0x62e1) {
      work = unlzw;
      method = 1;
      last_member = 1;
      iVar2 = unlzw(in_stack_00000058,(FILE *)status);
      if (iVar2 != 0) {
        method = -1;
        *in_stack_00000008 = 0x19e;
      }
      if (in_R9 != (long *)0x0) {
        *in_R9 = bytes_out;
      }
      local_4 = *in_stack_00000008;
    }
    else {
      error((char *)0x254fd9);
      local_4 = -1;
    }
  }
  else {
    local_4 = *in_stack_00000008;
  }
  return local_4;
}

Assistant:

int zuncompress2mem(char *filename,  /* name of input file                 */
             FILE *indiskfile,     /* I - file pointer                        */
             char **buffptr,   /* IO - memory pointer                     */
             size_t *buffsize,   /* IO - size of buffer, in bytes           */
             void *(*mem_realloc)(void *p, size_t newsize), /* function     */
             size_t *filesize,   /* O - size of file, in bytes              */
             int *status)        /* IO - error status                       */

/*
  Uncompress the file into memory.  Fill whatever amount of memory has
  already been allocated, then realloc more memory, using the supplied
  input function, if necessary.
*/
{
    char magic[2]; /* magic header */

    if (*status > 0)
        return(*status);

    /*  save input parameters into global variables */
    ifname[0] = '\0';
    strncat(ifname, filename, 127);
    ifd = indiskfile;
    memptr = (void **) buffptr;
    memsize = buffsize;
    realloc_fn = mem_realloc;

    /* clear input and output buffers */

    insize = inptr = 0;
    bytes_in = bytes_out = 0L;

    magic[0] = (char)get_byte();
    magic[1] = (char)get_byte();

    if (memcmp(magic, LZW_MAGIC, 2) != 0) {
      error("ERROR: input .Z file is in unrecognized compression format.\n");
      return(-1);
    }

    work = unlzw;
    method = COMPRESSED;
    last_member = 1;

    /* do the uncompression */
    if ((*work)(ifd, ofd) != OK) {
        method = -1; /* force cleanup */
        *status = 414;    /* report some sort of decompression error */
    }

    if (filesize)  *filesize = bytes_out;

    return(*status);
}